

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O3

void test_2d_dynamic<30ul,30ul>(void)

{
  pointer ptVar1;
  undefined8 uVar2;
  ulong uVar3;
  _Head_base<0UL,_int,_false> *t;
  value_type true_idx;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> data;
  _Head_base<1UL,_int,_false> local_68;
  _Head_base<0UL,_int,_false> local_64;
  tuple<int,_int> *local_60;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> local_58;
  tuple<int,_int> *local_40;
  pointer local_38;
  
  local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_58.
                         super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  local_60 = (tuple<int,_int> *)CONCAT71(local_60._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x7e,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",(bool *)&local_58,(bool *)&local_60
            );
  local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_60._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x80,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",(unsigned_long *)&local_58,
             (int *)&local_60);
  local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_60 = (tuple<int,_int> *)CONCAT44(local_60._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x81,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",(unsigned_long *)&local_58,
             (int *)&local_60);
  local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x384;
  local_60 = (tuple<int,_int> *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x83,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",(unsigned_long *)&local_58,
             (unsigned_long *)&local_60);
  local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x384;
  local_60 = (tuple<int,_int> *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x84,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",(unsigned_long *)&local_58,
             (unsigned_long *)&local_60);
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::vector
            (&local_58,900,(allocator_type *)&local_60);
  ptVar1 = local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_head_impl = 0;
  do {
    local_64._M_head_impl = 0;
    do {
      local_60 = (tuple<int,_int> *)
                 ((long)local_68._M_head_impl + (ulong)(uint)(local_64._M_head_impl * 0x1e));
      local_40 = local_60;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x8f,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",(unsigned_long *)&local_40,
                 (unsigned_long *)&local_60);
      local_40 = ptVar1 + (long)local_64._M_head_impl * 0x1e + (long)local_68._M_head_impl;
      local_38 = ptVar1 + (long)local_60;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x91,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",&local_40,&local_38);
      t = &ptVar1[(long)local_64._M_head_impl * 0x1e + (long)local_68._M_head_impl].
           super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>;
      t->_M_head_impl = local_64._M_head_impl;
      ptVar1[(long)local_64._M_head_impl * 0x1e + (long)local_68._M_head_impl].
      super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>
      ._M_head_impl = local_68._M_head_impl;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x96,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",&t->_M_head_impl,
                 &local_64._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x97,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",
                 (int *)(ptVar1 + (long)local_64._M_head_impl * 0x1e + (long)local_68._M_head_impl),
                 &local_68._M_head_impl);
      uVar3 = (long)local_64._M_head_impl * 0x1e + (long)local_68._M_head_impl;
      if ((ulong)((long)local_58.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) {
LAB_00107096:
        uVar2 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        if (local_58.
            super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.
                          super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar2);
      }
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(data.at(l.index(i, j))))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x9a,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",
                 &local_58.
                  super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3].super__Tuple_impl<0UL,_int,_int>.
                  super__Head_base<0UL,_int,_false>._M_head_impl,&local_64._M_head_impl);
      uVar3 = (long)local_64._M_head_impl * 0x1e + (long)local_68._M_head_impl;
      if ((ulong)((long)local_58.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_58.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) goto LAB_00107096;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(data.at(l.index(i, j))))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0x9b,"void test_2d_dynamic() [X = 30UL, Y = 30UL]",
                 (int *)(local_58.
                         super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar3),&local_68._M_head_impl);
      local_64._M_head_impl = local_64._M_head_impl + 1;
    } while ((uint)local_64._M_head_impl < 0x1e);
    local_68._M_head_impl = local_68._M_head_impl + 1;
    if (0x1d < (uint)local_68._M_head_impl) {
      if (local_58.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn>, dimensions<1, 1>, dimensions<0, 0>
    > const l{{X, Y}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    vector<tuple<int, int> > data(l[0] * l[1]);
    tuple<int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j)))), j); 
    }
}